

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::SimpleGraphicsPipelineBuilder::bindShaderStage
          (SimpleGraphicsPipelineBuilder *this,VkShaderStageFlagBits stage,char *sourceName,
          char *entryName)

{
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  char *pcVar1;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  ProgramBinary *pPVar3;
  deUint8 *pdVar4;
  size_t sVar5;
  Handle<(vk::HandleType)14> *pHVar6;
  Move<vk::Handle<(vk::HandleType)14>_> local_108;
  RefData<vk::Handle<(vk::HandleType)14>_> local_e8;
  undefined1 local_c8 [8];
  VkShaderModuleCreateInfo moduleCreateInfo;
  string local_98;
  undefined4 local_78;
  deUint32 codeSize;
  allocator<char> local_61;
  string local_60;
  deUint8 *local_40;
  deUint32 *code;
  VkDevice vkDevice;
  DeviceInterface *vk;
  char *entryName_local;
  char *sourceName_local;
  SimpleGraphicsPipelineBuilder *pSStack_10;
  VkShaderStageFlagBits stage_local;
  SimpleGraphicsPipelineBuilder_conflict *this_local;
  
  vk = (DeviceInterface *)entryName;
  entryName_local = sourceName;
  sourceName_local._4_4_ = stage;
  pSStack_10 = this;
  vkDevice = (VkDevice)Context::getDeviceInterface(this->m_context);
  code = (deUint32 *)Context::getDevice(this->m_context);
  pPVar2 = Context::getBinaryCollection(this->m_context);
  pcVar1 = entryName_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar1,&local_61);
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_60);
  pdVar4 = ::vk::ProgramBinary::getBinary(pPVar3);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_40 = pdVar4;
  pPVar2 = Context::getBinaryCollection(this->m_context);
  pcVar1 = entryName_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,pcVar1,(allocator<char> *)((long)&moduleCreateInfo.pCode + 7));
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_98);
  sVar5 = ::vk::ProgramBinary::getSize(pPVar3);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&moduleCreateInfo.pCode + 7));
  local_c8._0_4_ = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  moduleCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  moduleCreateInfo._4_4_ = 0;
  moduleCreateInfo.pNext._0_4_ = 0;
  moduleCreateInfo._16_8_ = sVar5 & 0xffffffff;
  moduleCreateInfo.codeSize = (deUintptr)local_40;
  local_78 = (int)sVar5;
  ::vk::createShaderModule
            (&local_108,(DeviceInterface *)vkDevice,(VkDevice)code,
             (VkShaderModuleCreateInfo *)local_c8,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e8,(Move *)&local_108);
  data.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data.object.m_internal = local_e8.object.m_internal;
  data.deleter.m_device = local_e8.deleter.m_device;
  data.deleter.m_allocator = local_e8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
            (this->m_shaderModules + this->m_shaderStageCount,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_108);
  this->m_shaderStageInfo[this->m_shaderStageCount].sType =
       VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  this->m_shaderStageInfo[this->m_shaderStageCount].pNext = (void *)0x0;
  this->m_shaderStageInfo[this->m_shaderStageCount].flags = 0;
  this->m_shaderStageInfo[this->m_shaderStageCount].stage = sourceName_local._4_4_;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     (&this->m_shaderModules[this->m_shaderStageCount].
                       super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  this->m_shaderStageInfo[this->m_shaderStageCount].module.m_internal = pHVar6->m_internal;
  this->m_shaderStageInfo[this->m_shaderStageCount].pName = (char *)vk;
  this->m_shaderStageInfo[this->m_shaderStageCount].pSpecializationInfo =
       (VkSpecializationInfo *)0x0;
  this->m_shaderStageCount = this->m_shaderStageCount + 1;
  return;
}

Assistant:

void SimpleGraphicsPipelineBuilder::bindShaderStage(VkShaderStageFlagBits stage,
													const char*           source_name,
													const char*           entry_name)
{
	const DeviceInterface&  vk        = m_context.getDeviceInterface();
	const VkDevice          vkDevice  = m_context.getDevice();

	// Create shader module
	deUint32*               pCode     = (deUint32*)m_context.getBinaryCollection().get(source_name).getBinary();
	deUint32                codeSize  = (deUint32)m_context.getBinaryCollection().get(source_name).getSize();

	const VkShaderModuleCreateInfo moduleCreateInfo =
	{
		VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO,                // VkStructureType             sType;
		DE_NULL,                                                    // const void*                 pNext;
		0u,                                                         // VkShaderModuleCreateFlags   flags;
		codeSize,                                                   // deUintptr                   codeSize;
		pCode,                                                      // const deUint32*             pCode;
	};

	m_shaderModules[m_shaderStageCount] = createShaderModule(vk, vkDevice, &moduleCreateInfo);

	// Prepare shader stage info
	m_shaderStageInfo[m_shaderStageCount].sType               = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
	m_shaderStageInfo[m_shaderStageCount].pNext               = DE_NULL;
	m_shaderStageInfo[m_shaderStageCount].flags               = 0u;
	m_shaderStageInfo[m_shaderStageCount].stage               = stage;
	m_shaderStageInfo[m_shaderStageCount].module              = *m_shaderModules[m_shaderStageCount];
	m_shaderStageInfo[m_shaderStageCount].pName               = entry_name;
	m_shaderStageInfo[m_shaderStageCount].pSpecializationInfo = DE_NULL;

	m_shaderStageCount++;
}